

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_warnings_off(APITests *this)

{
  runtime_error *this_00;
  string local_1c0 [8];
  long local_1b8;
  Warning w;
  
  GPIO::setwarnings(false);
  Warning::Warning(&w);
  GPIO::cleanup();
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string(local_1c0);
  if (local_1b8 == 0) {
    Warning::~Warning(&w);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unexpected warning occured");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_warnings_off()
    {
        GPIO::setwarnings(false);
        Warning w{};

        // cleanup() warns if no GPIOs were set up
        GPIO::cleanup();

        if (!w.contents().empty())
            throw std::runtime_error("Unexpected warning occured");
    }